

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioCtl.cc
# Opt level: O0

void __thiscall AudioCtl::timeShift(AudioCtl *this,int rows)

{
  long lVar1;
  __int_type _Var2;
  int iVar3;
  int local_18;
  int loop_length;
  int next_pos;
  int rows_local;
  AudioCtl *this_local;
  
  _Var2 = std::__atomic_base::operator_cast_to_int((__atomic_base *)&this->pos_);
  iVar3 = this->end_ - this->start_;
  for (local_18 = _Var2 + rows * this->settings_->samples_per_row; local_18 < this->start_;
      local_18 = iVar3 + local_18) {
  }
  for (; this->end_ < local_18; local_18 = local_18 - iVar3) {
  }
  std::__atomic_base<int>::operator=(&(this->pos_).super___atomic_base<int>,local_18);
  lVar1 = (long)this->settings_->samples_per_row;
  aAppDebugPrintf("pos = %d",(long)local_18 / lVar1 & 0xffffffff,(long)local_18 % lVar1 & 0xffffffff
                 );
  return;
}

Assistant:

void AudioCtl::timeShift(int rows) noexcept {
	int next_pos = pos_ + rows * settings_.samples_per_row;
	const int loop_length = end_ - start_;
	while (next_pos < start_)
		next_pos += loop_length;
	while (next_pos > end_)
		next_pos -= loop_length;
	pos_ = next_pos;
	MSG("pos = %d", next_pos / settings_.samples_per_row);
}